

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InvalidInputException::InvalidInputException<unsigned_char,unsigned_long>
          (InvalidInputException *this,string *msg,uchar params,unsigned_long params_1)

{
  undefined7 in_register_00000011;
  unsigned_long in_R8;
  string local_30;
  
  Exception::ConstructMessage<unsigned_char,unsigned_long>
            (&local_30,(Exception *)msg,(string *)CONCAT71(in_register_00000011,params),
             (uchar)params_1,in_R8);
  InvalidInputException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}